

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_node *
pugi::impl::(anonymous_namespace)::
min_element<pugi::xpath_node_const*,pugi::impl::(anonymous_namespace)::document_order_comparator>
          (xpath_node *begin,xpath_node *end,document_order_comparator *pred)

{
  bool bVar1;
  xpath_node *in_RSI;
  xpath_node *in_RDI;
  xpath_node *it;
  xpath_node *result;
  xpath_node *in_stack_00000088;
  xpath_node *in_stack_00000090;
  document_order_comparator *in_stack_00000098;
  xpath_node *local_28;
  xpath_node *local_20;
  
  local_20 = in_RDI;
  for (local_28 = in_RDI + 1; local_28 != in_RSI; local_28 = local_28 + 1) {
    bVar1 = anon_unknown_0::document_order_comparator::operator()
                      (in_stack_00000098,in_stack_00000090,in_stack_00000088);
    if (bVar1) {
      local_20 = local_28;
    }
  }
  return local_20;
}

Assistant:

PUGI__FN I min_element(I begin, I end, const Pred& pred)
	{
		I result = begin;

		for (I it = begin + 1; it != end; ++it)
			if (pred(*it, *result))
				result = it;

		return result;
	}